

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<long>::erase(RepeatedField<long> *this,const_iterator position)

{
  iterator plVar1;
  const_iterator in_stack_00000018;
  RepeatedField<long> *in_stack_00000020;
  
  plVar1 = erase(in_stack_00000020,in_stack_00000018,(const_iterator)this);
  return plVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}